

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

bool deqp::gls::isTessellationPresent(ShaderCaseSpecification *spec)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  byte local_25;
  int local_20;
  int programNdx;
  deUint32 tessellationBits;
  ShaderCaseSpecification *spec_local;
  
  pvVar2 = std::
           vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
           operator[](&spec->programs,0);
  if (((pvVar2->sources).separable & 1U) == 0) {
    pvVar2 = std::
             vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
             operator[](&spec->programs,0);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((pvVar2->sources).sources + 3);
    local_25 = 1;
    if (bVar1) {
      pvVar2 = std::
               vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ::operator[](&spec->programs,0);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((pvVar2->sources).sources + 4);
      local_25 = bVar1 ^ 0xff;
    }
    spec_local._7_1_ = (bool)(local_25 & 1);
  }
  else {
    for (local_20 = 0;
        sVar3 = std::
                vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ::size(&spec->programs), local_20 < (int)sVar3; local_20 = local_20 + 1) {
      pvVar2 = std::
               vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ::operator[](&spec->programs,(long)local_20);
      if ((pvVar2->activeStages & 0x18) != 0) {
        return true;
      }
    }
    spec_local._7_1_ = false;
  }
  return spec_local._7_1_;
}

Assistant:

static bool isTessellationPresent (const ShaderCaseSpecification& spec)
{
	if (spec.programs[0].sources.separable)
	{
		const deUint32 tessellationBits =	(1 << glu::SHADERTYPE_TESSELLATION_CONTROL)		|
											(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION);

		for (int programNdx = 0; programNdx < (int)spec.programs.size(); ++programNdx)
			if (spec.programs[programNdx].activeStages & tessellationBits)
				return true;
		return false;
	}
	else
		return !spec.programs[0].sources.sources[glu::SHADERTYPE_TESSELLATION_CONTROL].empty() ||
			   !spec.programs[0].sources.sources[glu::SHADERTYPE_TESSELLATION_EVALUATION].empty();
}